

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogButtons(void)

{
  ImVector<unsigned_int> *pIVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ImGuiContext *g;
  ImVec2 local_28;
  
  pIVar4 = GImGui;
  PushID("LogButtons");
  local_28.x = 0.0;
  local_28.y = 0.0;
  bVar6 = Button("Log To TTY",&local_28);
  pIVar3 = GImGui->CurrentWindow;
  if (pIVar3->SkipItems == false) {
    (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
    (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
    (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
    (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    (pIVar3->DC).IsSameLine = true;
  }
  local_28.x = 0.0;
  local_28.y = 0.0;
  bVar7 = Button("Log To File",&local_28);
  pIVar3 = GImGui->CurrentWindow;
  if (pIVar3->SkipItems == false) {
    (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
    (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
    (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
    (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    (pIVar3->DC).IsSameLine = true;
  }
  local_28.x = 0.0;
  local_28.y = 0.0;
  bVar8 = Button("Log To Clipboard",&local_28);
  pIVar3 = GImGui->CurrentWindow;
  if (pIVar3->SkipItems == false) {
    (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
    (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
    (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
    (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    (pIVar3->DC).IsSameLine = true;
  }
  PushItemFlag(1,true);
  pIVar5 = GImGui;
  (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
  (pIVar5->NextItemData).Width = 80.0;
  SliderInt("Default Depth",&pIVar4->LogDepthToExpandDefault,0,9,(char *)0x0,0);
  pIVar4 = GImGui;
  iVar2 = (GImGui->ItemFlagsStack).Size;
  (GImGui->ItemFlagsStack).Size = iVar2 + -1;
  pIVar4->CurrentItemFlags = (pIVar4->ItemFlagsStack).Data[(long)iVar2 + -2];
  pIVar1 = &pIVar4->CurrentWindow->IDStack;
  pIVar1->Size = pIVar1->Size + -1;
  if ((bVar6) && (pIVar4->LogEnabled == false)) {
    pIVar4->LogEnabled = true;
    pIVar4->LogType = ImGuiLogType_TTY;
    pIVar4->LogNextPrefix = (char *)0x0;
    pIVar4->LogNextSuffix = (char *)0x0;
    pIVar4->LogDepthRef = (pIVar4->CurrentWindow->DC).TreeDepth;
    pIVar4->LogDepthToExpand = pIVar4->LogDepthToExpandDefault;
    pIVar4->LogLinePosY = 3.4028235e+38;
    pIVar4->LogLineFirstItem = true;
    pIVar4->LogFile = _stdout;
  }
  if (bVar7) {
    LogToFile(-1,(char *)0x0);
  }
  pIVar4 = GImGui;
  if ((bVar8) && (GImGui->LogEnabled == false)) {
    pIVar3 = GImGui->CurrentWindow;
    GImGui->LogEnabled = true;
    pIVar4->LogType = ImGuiLogType_Clipboard;
    pIVar4->LogNextPrefix = (char *)0x0;
    pIVar4->LogNextSuffix = (char *)0x0;
    pIVar4->LogDepthRef = (pIVar3->DC).TreeDepth;
    pIVar4->LogDepthToExpand = pIVar4->LogDepthToExpandDefault;
    pIVar4->LogLinePosY = 3.4028235e+38;
    pIVar4->LogLineFirstItem = true;
  }
  return;
}

Assistant:

void ImGui::LogButtons()
{
    ImGuiContext& g = *GImGui;

    PushID("LogButtons");
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
    const bool log_to_tty = Button("Log To TTY"); SameLine();
#else
    const bool log_to_tty = false;
#endif
    const bool log_to_file = Button("Log To File"); SameLine();
    const bool log_to_clipboard = Button("Log To Clipboard"); SameLine();
    PushAllowKeyboardFocus(false);
    SetNextItemWidth(80.0f);
    SliderInt("Default Depth", &g.LogDepthToExpandDefault, 0, 9, NULL);
    PopAllowKeyboardFocus();
    PopID();

    // Start logging at the end of the function so that the buttons don't appear in the log
    if (log_to_tty)
        LogToTTY();
    if (log_to_file)
        LogToFile();
    if (log_to_clipboard)
        LogToClipboard();
}